

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_kernel.c
# Opt level: O1

int mk_kernel_features_print(char *buffer,size_t size,mk_server *server)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  iVar1 = 0;
  bVar4 = (server->kernel_features & 1) != 0;
  if (bVar4) {
    iVar1 = snprintf(buffer,size,"%s","TCP_FASTOPEN ");
  }
  uVar3 = (uint)bVar4;
  if ((server->kernel_features & 2) != 0) {
    if (server->scheduler_mode == '\0') {
      iVar2 = snprintf(buffer + iVar1,size - (long)iVar1,"%s!%s","\x1b[1m\x1b[91m","\x1b[0m");
      iVar1 = iVar1 + iVar2;
    }
    iVar2 = snprintf(buffer + iVar1,size - (long)iVar1,"%s","SO_REUSEPORT ");
    iVar1 = iVar1 + iVar2;
    uVar3 = bVar4 + 1;
  }
  if ((server->kernel_features & 4) != 0) {
    snprintf(buffer + iVar1,size - (long)iVar1,"%s","TCP_AUTOCORKING ");
    uVar3 = uVar3 + 1;
  }
  return uVar3;
}

Assistant:

int mk_kernel_features_print(char *buffer, size_t size,
                             struct mk_server *server)
{
    int offset = 0;
    int features = 0;

    if (server->kernel_features & MK_KERNEL_TCP_FASTOPEN) {
        offset += snprintf(buffer, size - offset, "%s", "TCP_FASTOPEN ");
        features++;
    }

    if (server->kernel_features & MK_KERNEL_SO_REUSEPORT) {
        if (server->scheduler_mode == MK_SCHEDULER_FAIR_BALANCING) {
            offset += snprintf(buffer + offset, size - offset,
                               "%s!%s", ANSI_BOLD ANSI_RED, ANSI_RESET);
        }
        offset += snprintf(buffer + offset, size - offset, "%s", "SO_REUSEPORT ");
        features++;
    }

    if (server->kernel_features & MK_KERNEL_TCP_AUTOCORKING) {
        snprintf(buffer + offset, size - offset, "%s", "TCP_AUTOCORKING ");
        features++;
    }

    return features;
}